

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Reader * __thiscall
capnp::DynamicList::Reader::operator[](Reader *__return_storage_ptr__,Reader *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  SegmentReader *pSVar7;
  CapTableReader *pCVar8;
  ElementSize expectedElementSize;
  Which WVar9;
  StructSchema SVar10;
  ulong uVar11;
  EnumSchema EVar12;
  InterfaceSchema IVar13;
  Type TVar14;
  ArrayPtr<const_unsigned_char> AVar15;
  Fault f;
  undefined1 local_c0 [24];
  CapTableReader *pCStack_a8;
  byte *local_a0;
  int local_98;
  StructReader local_90;
  ListReader local_60;
  
  if ((this->reader).elementCount <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)(local_c0 + 0x10),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x410,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal((Fault *)(local_c0 + 0x10));
  }
  WVar9 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar9 = (this->schema).elementType.baseType;
  }
  switch(WVar9) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->reader).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar11 = (ulong)(char)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_001a879c;
  case INT16:
    uVar11 = (ulong)*(short *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_001a879c;
  case INT32:
    uVar11 = (ulong)*(int *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_001a879c;
  case INT64:
    uVar11 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_001a879c:
    __return_storage_ptr__->type = INT;
LAB_001a8872:
    (__return_storage_ptr__->field_1).intValue = uVar11;
    break;
  case UINT8:
    uVar11 = (ulong)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_001a886c;
  case UINT16:
    uVar11 = (ulong)*(ushort *)
                     ((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_001a886c;
  case UINT32:
    uVar11 = (ulong)*(uint *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3))
    ;
    goto LAB_001a886c;
  case UINT64:
    uVar11 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_001a886c:
    __return_storage_ptr__->type = UINT;
    goto LAB_001a8872;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_001a884a;
  case FLOAT64:
    dVar1 = *(double *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_001a884a:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    local_c0._16_8_ = (this->reader).segment;
    pCStack_a8 = (this->reader).capTable;
    local_a0 = (this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3);
    local_98 = (this->reader).nestingLimit;
    AVar15 = (ArrayPtr<const_unsigned_char>)
             _::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)(local_c0 + 0x10),(void *)0x0,0);
    __return_storage_ptr__->type = TEXT;
    goto LAB_001a87e0;
  case DATA:
    local_c0._16_8_ = (this->reader).segment;
    pCStack_a8 = (this->reader).capTable;
    local_a0 = (this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3);
    local_98 = (this->reader).nestingLimit;
    AVar15 = (ArrayPtr<const_unsigned_char>)
             _::PointerReader::getBlob<capnp::Data>
                       ((PointerReader *)(local_c0 + 0x10),(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
LAB_001a87e0:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar15;
    break;
  case LIST:
    TVar14 = (Type)Type::asList((Type *)this);
    local_c0._16_8_ = (this->reader).segment;
    pCStack_a8 = (this->reader).capTable;
    local_a0 = (this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3);
    local_98 = (this->reader).nestingLimit;
    WVar9 = LIST;
    if (((undefined1  [16])TVar14 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar9 = TVar14.baseType;
    }
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar9);
    _::PointerReader::getList
              (&local_60,(PointerReader *)(local_c0 + 0x10),expectedElementSize,(word *)0x0);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_60.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_60.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_60.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_60._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_60.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_60._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_60.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_60.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_60.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_60.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_60.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar14;
    break;
  case ENUM:
    EVar12 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar12.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar10 = Type::asStruct((Type *)this);
    _::ListReader::getStructElement(&local_90,&this->reader,index);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_90._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_90.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_90._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_90._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_90._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_90.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_90.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_90.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_90.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar10.super_Schema.raw;
    break;
  case INTERFACE:
    IVar13 = Type::asInterface((Type *)this);
    local_c0._16_8_ = (this->reader).segment;
    pCStack_a8 = (this->reader).capTable;
    local_a0 = (this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3);
    local_98 = (this->reader).nestingLimit;
    _::PointerReader::getCapability((PointerReader *)local_c0);
    __return_storage_ptr__->type = CAPABILITY;
    *(undefined4 *)&__return_storage_ptr__->field_1 = local_c0._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = local_c0._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = local_c0._8_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = local_c0._12_4_;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar13.super_Schema.raw;
    break;
  case ANY_POINTER:
    pSVar7 = (this->reader).segment;
    pCVar8 = (this->reader).capTable;
    uVar4 = (this->reader).step;
    pbVar6 = (this->reader).ptr;
    iVar5 = (this->reader).nestingLimit;
    __return_storage_ptr__->type = ANY_POINTER;
    (__return_storage_ptr__->field_1).intValue = (int64_t)pSVar7;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = (size_t)pCVar8;
    (__return_storage_ptr__->field_1).listValue.reader.segment =
         (SegmentReader *)(pbVar6 + ((ulong)uVar4 * (ulong)index >> 3));
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x18) = iVar5;
    break;
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicList::Reader::operator[](uint index) const {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return reader.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();
      return DynamicList::Reader(elementType,
          reader.getPointerElement(bounded(index) * ELEMENTS)
                .getList(elementSizeFor(elementType.whichElementType()), nullptr));
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Reader(schema.getStructElementType(),
                                   reader.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         reader.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      return AnyPointer::Reader(reader.getPointerElement(bounded(index) * ELEMENTS));

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       reader.getPointerElement(bounded(index) * ELEMENTS)
                                             .getCapability());
  }

  return nullptr;
}